

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O0

void __thiscall StimulationCommand::StimulationCommand(StimulationCommand *this)

{
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__StimulationCommand_005d6688;
  *(undefined2 *)((long)&in_RDI[4]._vptr_NetworkDataType + 2) = 0;
  *(undefined1 *)((long)&in_RDI[4]._vptr_NetworkDataType + 4) = 0;
  *(undefined2 *)((long)&in_RDI[4]._vptr_NetworkDataType + 6) = 0;
  *(undefined2 *)((long)&in_RDI[5]._vptr_NetworkDataType + 2) = 0;
  *(undefined2 *)((long)&in_RDI[5]._vptr_NetworkDataType + 4) = 0;
  *(undefined2 *)((long)&in_RDI[5]._vptr_NetworkDataType + 6) = 0;
  *(undefined2 *)((long)&in_RDI[6]._vptr_NetworkDataType + 4) = 0;
  *(undefined1 *)((long)&in_RDI[7]._vptr_NetworkDataType + 2) = 0;
  *(undefined2 *)((long)&in_RDI[7]._vptr_NetworkDataType + 4) = 0;
  *(undefined2 *)((long)&in_RDI[7]._vptr_NetworkDataType + 6) = 0;
  *(undefined2 *)&in_RDI[8]._vptr_NetworkDataType = 0;
  *(undefined2 *)((long)&in_RDI[8]._vptr_NetworkDataType + 2) = 0;
  *(undefined1 *)&in_RDI[1]._vptr_NetworkDataType = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_NetworkDataType + 1) = 1;
  *(undefined1 *)((long)&in_RDI[8]._vptr_NetworkDataType + 4) = 0;
  *(undefined1 *)((long)&in_RDI[7]._vptr_NetworkDataType + 3) = 1;
  *(undefined2 *)&in_RDI[6]._vptr_NetworkDataType = 10;
  *(undefined2 *)((long)&in_RDI[6]._vptr_NetworkDataType + 2) = 10;
  *(undefined2 *)((long)&in_RDI[6]._vptr_NetworkDataType + 6) = 10;
  *(undefined2 *)&in_RDI[7]._vptr_NetworkDataType = 500;
  *(undefined1 *)((long)&in_RDI[8]._vptr_NetworkDataType + 5) = 0;
  *(undefined1 *)((long)&in_RDI[8]._vptr_NetworkDataType + 6) = 0;
  *(undefined1 *)((long)&in_RDI[8]._vptr_NetworkDataType + 7) = 0;
  return;
}

Assistant:

StimulationCommand::StimulationCommand() {


    leadingPulseWidth_Samples = 0;
    leadingPulseAmplitude = 0;
    secondPulseWidth_Samples = 0;
    pulsePeriod_Samples = 0;
    numPulsesInTrain = 0;
    interPhaseDwell_Samples = 0;
    startDelay_Samples = 0; //Delay after go signal.  Useful for synchronizing multiple stim trains with relative delays
    anodePulseLeading = false;
    cathodeChannel = 0;
    anodeChannel = 0;
    cathodeNtrodeID = 0;
    anodeNtrodeID = 0;
    _group = 0;
    _pulseMode = 0x01; //default is biphasic with dwell and cathode leading
    slot = 0;

    //Default settle and charge recovery behavior
    settleOn = true;
    preSettle_Samples = 10;
    postSettle_Samples = 10;
    chargeRecoveryDelay_Samples = 10;
    chargeRecoveryLength_Samples = 500;

    //Validation flags
    channelIsSet = false;
    slotIsSet = false;
    sequencerIsSet = false;


}